

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicRectMatrix.hpp
# Opt level: O0

DynamicRectMatrix<double> __thiscall
OpenMD::DynamicRectMatrix<double>::operator=
          (DynamicRectMatrix<double> *this,DynamicRectMatrix<double> *m)

{
  uint uVar1;
  uint uVar2;
  DynamicRectMatrix<double> *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  DynamicRectMatrix<double> *in_RSI;
  DynamicRectMatrix<double> *in_RDI;
  DynamicRectMatrix<double> DVar4;
  uint j;
  uint i;
  DynamicRectMatrix<double> *this_00;
  uint local_20;
  uint local_1c;
  
  if (in_RSI == in_RDX) {
    DynamicRectMatrix(in_RDI,in_RDI);
    uVar3 = extraout_RDX;
    this_00 = in_RDI;
    goto LAB_00269020;
  }
  uVar1 = in_RSI->nrow_;
  this_00 = in_RDI;
  uVar2 = getNRow(in_RDX);
  if (uVar1 == uVar2) {
    uVar1 = in_RSI->ncol_;
    uVar2 = getNCol(in_RDX);
    if (uVar1 != uVar2) goto LAB_00268f65;
  }
  else {
LAB_00268f65:
    deallocate(this_00);
    getNRow(in_RDX);
    getNCol(in_RDX);
    allocate(this_00,(uint)((ulong)in_RDI >> 0x20),(uint)in_RDI);
  }
  for (local_1c = 0; local_1c < in_RSI->nrow_; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < in_RSI->ncol_; local_20 = local_20 + 1) {
      in_RSI->data_[local_1c][local_20] = in_RDX->data_[local_1c][local_20];
    }
  }
  DynamicRectMatrix(this_00,in_RDI);
  uVar3 = extraout_RDX_00;
LAB_00269020:
  DVar4.nrow_ = (int)uVar3;
  DVar4.ncol_ = (int)((ulong)uVar3 >> 0x20);
  DVar4.data_ = (double **)this_00;
  return DVar4;
}

Assistant:

DynamicRectMatrix<Real> operator=(const DynamicRectMatrix<Real>& m) {
      if (this == &m) return *this;
      if (nrow_ != m.getNRow() || ncol_ != m.getNCol()) {
        deallocate();
        allocate(m.getNRow(), m.getNCol());
      }

      for (unsigned int i = 0; i < nrow_; i++)
        for (unsigned int j = 0; j < ncol_; j++)
          this->data_[i][j] = m.data_[i][j];
      return *this;
    }